

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_memory_object.h
# Opt level: O2

void __thiscall
SharedMemoryObject<pthread_mutex_t>::SharedMemoryObject<>(SharedMemoryObject<pthread_mutex_t> *this)

{
  pthread_mutex_t *ppVar1;
  ContextManager *pCVar2;
  string local_30;
  
  ppVar1 = (pthread_mutex_t *)allocate_shared_memory(0x28);
  (ppVar1->__data).__list.__next = (__pthread_internal_list *)0x0;
  ppVar1->__align = 0;
  *(int *)((long)ppVar1 + 8) = 0;
  *(uint *)((long)ppVar1 + 0xc) = 0;
  *(int *)((long)ppVar1 + 0x10) = 0;
  *(short *)((long)ppVar1 + 0x14) = 0;
  *(short *)((long)ppVar1 + 0x16) = 0;
  (ppVar1->__data).__list.__prev = (__pthread_internal_list *)0x0;
  this->ptr_ = ppVar1;
  if (ppVar1 == (pthread_mutex_t *)0xffffffffffffffff) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Cannot allocate %zu bytes of shared memory: %m",0x28);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

explicit SharedMemoryObject(Args &&... args) {
        ptr_ = static_cast<T *>(allocate_shared_memory(sizeof(T)));
        ptr_ = new(ptr_) T(args...);
        if (ptr_ == MAP_FAILED) {
            die(format("Cannot allocate %zu bytes of shared memory: %m", sizeof(T)));
        }
    }